

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxKeys.cxx
# Opt level: O2

void __thiscall LinuxKeys::LinuxKeys(LinuxKeys *this)

{
  ulong uVar1;
  undefined8 uVar2;
  int __fd;
  termios term;
  termios local_58;
  
  __fd = fileno(_stdin);
  this->stdinFd_ = __fd;
  (this->originalTermios_).c_iflag = 0;
  (this->originalTermios_).c_oflag = 0;
  (this->originalTermios_).c_cflag = 0;
  (this->originalTermios_).c_lflag = 0;
  (this->originalTermios_).c_line = '\0';
  (this->originalTermios_).c_cc[0] = '\0';
  (this->originalTermios_).c_cc[1] = '\0';
  (this->originalTermios_).c_cc[2] = '\0';
  (this->originalTermios_).c_cc[3] = '\0';
  (this->originalTermios_).c_cc[4] = '\0';
  (this->originalTermios_).c_cc[5] = '\0';
  (this->originalTermios_).c_cc[6] = '\0';
  (this->originalTermios_).c_cc[7] = '\0';
  (this->originalTermios_).c_cc[8] = '\0';
  (this->originalTermios_).c_cc[9] = '\0';
  (this->originalTermios_).c_cc[10] = '\0';
  (this->originalTermios_).c_cc[0xb] = '\0';
  (this->originalTermios_).c_cc[0xc] = '\0';
  (this->originalTermios_).c_cc[0xd] = '\0';
  (this->originalTermios_).c_cc[0xe] = '\0';
  (this->originalTermios_).c_cc[0xf] = '\0';
  (this->originalTermios_).c_cc[0x10] = '\0';
  (this->originalTermios_).c_cc[0x11] = '\0';
  (this->originalTermios_).c_cc[0x12] = '\0';
  (this->originalTermios_).c_cc[0x13] = '\0';
  (this->originalTermios_).c_cc[0x14] = '\0';
  (this->originalTermios_).c_cc[0x15] = '\0';
  (this->originalTermios_).c_cc[0x16] = '\0';
  (this->originalTermios_).c_cc[0x17] = '\0';
  (this->originalTermios_).c_cc[0x18] = '\0';
  (this->originalTermios_).c_cc[0x19] = '\0';
  (this->originalTermios_).c_cc[0x1a] = '\0';
  (this->originalTermios_).c_cc[0x1b] = '\0';
  (this->originalTermios_).c_cc[0x1c] = '\0';
  (this->originalTermios_).c_cc[0x1d] = '\0';
  (this->originalTermios_).c_cc[0x1e] = '\0';
  *(undefined8 *)((this->originalTermios_).c_cc + 0x1b) = 0;
  (this->originalTermios_).c_ispeed = 0;
  (this->originalTermios_).c_ospeed = 0;
  tcgetattr(__fd,(termios *)&this->originalTermios_);
  local_58.c_iflag = (this->originalTermios_).c_iflag;
  local_58.c_oflag = (this->originalTermios_).c_oflag;
  uVar1._0_4_ = (this->originalTermios_).c_cflag;
  uVar1._4_4_ = (this->originalTermios_).c_lflag;
  local_58.c_line = (this->originalTermios_).c_line;
  local_58.c_cc[0] = (this->originalTermios_).c_cc[0];
  local_58.c_cc[1] = (this->originalTermios_).c_cc[1];
  local_58.c_cc[2] = (this->originalTermios_).c_cc[2];
  local_58.c_cc[3] = (this->originalTermios_).c_cc[3];
  local_58.c_cc[4] = (this->originalTermios_).c_cc[4];
  local_58.c_cc[5] = (this->originalTermios_).c_cc[5];
  local_58.c_cc[6] = (this->originalTermios_).c_cc[6];
  local_58.c_cc._7_8_ = *(undefined8 *)((this->originalTermios_).c_cc + 7);
  local_58.c_cc._15_8_ = *(undefined8 *)((this->originalTermios_).c_cc + 0xf);
  uVar2 = *(undefined8 *)((this->originalTermios_).c_cc + 0x17);
  local_58.c_ispeed = (this->originalTermios_).c_ispeed;
  local_58.c_ospeed = (this->originalTermios_).c_ospeed;
  local_58._48_4_ = SUB84((ulong)*(undefined8 *)((this->originalTermios_).c_cc + 0x1b) >> 0x20,0);
  local_58.c_cc._23_4_ = SUB84(uVar2,0);
  local_58.c_cc._27_4_ = SUB84((ulong)uVar2 >> 0x20,0);
  local_58._8_8_ = uVar1 & 0xfffffff5ffffffff;
  tcsetattr(this->stdinFd_,0,&local_58);
  setbuf(_stdin,(char *)0x0);
  return;
}

Assistant:

LinuxKeys::LinuxKeys()
:
    stdinFd_{fileno(stdin)},
    originalTermios_{}
{
        tcgetattr(stdinFd_, &originalTermios_);

        struct termios term;
        memcpy(&term, &originalTermios_, sizeof(term));

        term.c_lflag &= ~(ICANON|ECHO);
        tcsetattr(stdinFd_, TCSANOW, &term);

        setbuf(stdin, NULL);
}